

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_sendmsg(nng_socket s,nng_msg *msg,int flags)

{
  nni_sock *local_1f0;
  nni_sock *sock;
  nni_aio aio;
  int rv;
  int flags_local;
  nng_msg *msg_local;
  nng_socket s_local;
  
  if (msg == (nng_msg *)0x0) {
    msg_local._4_4_ = NNG_EINVAL;
  }
  else {
    aio.a_reap_node.rn_next._4_4_ = flags;
    aio.a_reap_node.rn_next._0_4_ = nni_sock_find(&local_1f0,s.id);
    msg_local._4_4_ = (nng_err)aio.a_reap_node.rn_next;
    if ((nng_err)aio.a_reap_node.rn_next == NNG_OK) {
      nni_aio_init((nni_aio *)&sock,(nni_cb)0x0,(void *)0x0);
      if ((aio.a_reap_node.rn_next._4_4_ & 2) == 2) {
        nni_aio_set_timeout((nni_aio *)&sock,0);
      }
      else {
        nni_aio_set_timeout((nni_aio *)&sock,-2);
      }
      nng_aio_set_msg((nng_aio *)&sock,msg);
      nni_sock_send(local_1f0,(nni_aio *)&sock);
      nni_sock_rele(local_1f0);
      nni_aio_wait((nni_aio *)&sock);
      aio.a_reap_node.rn_next._0_4_ = nni_aio_result((nni_aio *)&sock);
      nni_aio_fini((nni_aio *)&sock);
      if (((nng_err)aio.a_reap_node.rn_next == NNG_ETIMEDOUT) &&
         ((aio.a_reap_node.rn_next._4_4_ & 2) == 2)) {
        aio.a_reap_node.rn_next._0_4_ = NNG_EAGAIN;
      }
      msg_local._4_4_ = (nng_err)aio.a_reap_node.rn_next;
    }
  }
  return msg_local._4_4_;
}

Assistant:

int
nng_sendmsg(nng_socket s, nng_msg *msg, int flags)
{
	int       rv;
	nni_aio   aio;
	nni_sock *sock;

	if (msg == NULL) {
		return (NNG_EINVAL);
	}
	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}

	nni_aio_init(&aio, NULL, NULL);
	if ((flags & NNG_FLAG_NONBLOCK) == NNG_FLAG_NONBLOCK) {
		nni_aio_set_timeout(&aio, NNG_DURATION_ZERO);
	} else {
		nni_aio_set_timeout(&aio, NNG_DURATION_DEFAULT);
	}

	nng_aio_set_msg(&aio, msg);
	nni_sock_send(sock, &aio);
	nni_sock_rele(sock);

	nni_aio_wait(&aio);
	rv = nni_aio_result(&aio);
	nni_aio_fini(&aio);

	// Possibly massage nonblocking attempt.  Note that nonblocking is
	// still done asynchronously, and the calling thread loses context.
	if ((rv == NNG_ETIMEDOUT) &&
	    ((flags & NNG_FLAG_NONBLOCK) == NNG_FLAG_NONBLOCK)) {
		rv = NNG_EAGAIN;
	}

	return (rv);
}